

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_AllocateSideDefs(int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  size_t __n;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)count;
  __n = SUB168(auVar1 * ZEXT816(0xc0),0);
  sVar5 = __n;
  if (SUB168(auVar1 * ZEXT816(0xc0),8) != 0) {
    sVar5 = 0xffffffffffffffff;
  }
  sides = (side_t *)operator_new__(sVar5);
  memset(sides,0,__n);
  iVar3 = numvertexes;
  if (numvertexes < count) {
    iVar3 = count;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  sidetemp = (sidei_t *)operator_new__(uVar6);
  if (0 < count) {
    lVar4 = 0;
    do {
      *(undefined2 *)((long)&sidetemp->field_0 + lVar4) = 0;
      *(undefined2 *)((long)&sidetemp->field_0 + lVar4 + 2) = 0;
      *(undefined2 *)((long)&sidetemp->field_0 + lVar4 + 4) = 0x8000;
      *(undefined4 *)((long)&sidetemp->field_0 + lVar4 + 8) = 0xffffffff;
      lVar4 = lVar4 + 0xc;
    } while ((ulong)(uint)count * 0xc != lVar4);
  }
  if (count < numsides) {
    Printf("Map has %d unused sidedefs\n");
  }
  numsides = count;
  sidecount = 0;
  return;
}

Assistant:

static void P_AllocateSideDefs (int count)
{
	int i;

	sides = new side_t[count];
	memset (sides, 0, count*sizeof(side_t));

	sidetemp = new sidei_t[MAX(count,numvertexes)];
	for (i = 0; i < count; i++)
	{
		sidetemp[i].a.special = sidetemp[i].a.tag = 0;
		sidetemp[i].a.alpha = SHRT_MIN;
		sidetemp[i].a.map = NO_SIDE;
	}
	if (count < numsides)
	{
		Printf ("Map has %d unused sidedefs\n", numsides - count);
	}
	numsides = count;
	sidecount = 0;
}